

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

string * slang::ast::formatWidth<slang::ast::StreamingConcatenationExpression>
                   (string *__return_storage_ptr__,StreamingConcatenationExpression *bitstream,
                   BitstreamSizeMode mode)

{
  unsigned_long uVar1;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  pair<unsigned_long,_unsigned_long> pVar2;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  FormatBuffer buffer;
  unsigned_long local_278 [2];
  unsigned_long local_268;
  buffer<char> local_250;
  char local_230 [504];
  undefined1 local_38;
  
  local_250.size_ = 0;
  local_250._vptr_buffer = (_func_int **)&PTR_grow_004e96c0;
  local_250.capacity_ = 500;
  local_38 = 0;
  local_250.ptr_ = local_230;
  pVar2 = dynamicBitstreamSize(bitstream,mode);
  local_278[0] = pVar2.second;
  uVar1 = pVar2.first;
  if (uVar1 == 0) {
    fmt_00.size_ = 2;
    fmt_00.data_ = "{}";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_278;
    args_00.desc_ = 4;
    ::fmt::v9::detail::vformat_to<char>(&local_250,fmt_00,args_00,(locale_ref)0x0);
  }
  else if (local_278[0] == 0) {
    fmt_01.size_ = 4;
    fmt_01.data_ = "{}*n";
    args_01.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_278;
    args_01.desc_ = 4;
    local_278[0] = uVar1;
    ::fmt::v9::detail::vformat_to<char>(&local_250,fmt_01,args_01,(locale_ref)0x0);
  }
  else {
    fmt.size_ = 7;
    fmt.data_ = "{}*n+{}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_278;
    args.desc_ = 0x44;
    local_268 = local_278[0];
    local_278[0] = uVar1;
    ::fmt::v9::detail::vformat_to<char>(&local_250,fmt,args,(locale_ref)0x0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_250.ptr_,local_250.ptr_ + local_250.size_);
  if (local_250.ptr_ != local_230) {
    operator_delete(local_250.ptr_,local_250.capacity_);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string formatWidth(const T& bitstream, BitstreamSizeMode mode) {
    FormatBuffer buffer;
    auto [multiplier, fixedSize] = dynamicBitstreamSize(bitstream, mode);
    if (!multiplier)
        buffer.format("{}", fixedSize);
    else if (!fixedSize)
        buffer.format("{}*n", multiplier);
    else
        buffer.format("{}*n+{}", multiplier, fixedSize);
    return buffer.str();
}